

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int uv_tcp_init_ex(uv_loop_t *loop,uv_tcp_t *tcp,uint flags)

{
  uv__queue *puVar1;
  int iVar2;
  int iVar3;
  uint domain;
  
  domain = flags & 0xff;
  iVar3 = -0x16;
  if ((flags < 0x100) && ((flags & 0xf7) == 2 || domain == 0)) {
    uv__stream_init(loop,(uv_stream_t *)tcp,UV_TCP);
    iVar3 = 0;
    if (domain != 0) {
      iVar2 = new_socket(tcp,domain,0);
      iVar3 = 0;
      if (iVar2 != 0) {
        puVar1 = (tcp->handle_queue).next;
        ((tcp->handle_queue).prev)->next = puVar1;
        puVar1->prev = (tcp->handle_queue).prev;
        iVar3 = (tcp->io_watcher).fd;
        if (iVar3 != -1) {
          uv__close(iVar3);
        }
        (tcp->io_watcher).fd = -1;
        iVar3 = iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_tcp_init_ex(uv_loop_t* loop, uv_tcp_t* tcp, unsigned int flags) {
  int domain;
  int err;

  /* Use the lower 8 bits for the domain */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  if (flags & ~0xFF)
    return UV_EINVAL;

  uv__stream_init(loop, (uv_stream_t*)tcp, UV_TCP);

  /* If anything fails beyond this point we need to remove the handle from
   * the handle queue, since it was added by uv__handle_init in uv_stream_init.
   */

  if (domain != AF_UNSPEC) {
    err = new_socket(tcp, domain, 0);
    if (err) {
      uv__queue_remove(&tcp->handle_queue);
      if (tcp->io_watcher.fd != -1)
        uv__close(tcp->io_watcher.fd);
      tcp->io_watcher.fd = -1;
      return err;
    }
  }

  return 0;
}